

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O1

void __thiscall helics::apps::AsioBrokerServer::mainLoop(AsioBrokerServer *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  undefined1 local_98 [40];
  undefined1 local_70 [24];
  undefined1 local_58 [16];
  pointer local_48;
  code *pcStack_40;
  undefined1 local_38 [24];
  code *pcStack_20;
  
  local_98._8_8_ = (element_type *)0x0;
  local_98[0x10] = '\0';
  local_98._0_8_ = (element_type *)(local_98 + 0x10);
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)(local_98 + 0x28),(string *)local_98);
  if ((element_type *)local_98._0_8_ != (element_type *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
  }
  if (this->tcp_enabled_ == true) {
    loadTCPserver((AsioBrokerServer *)local_98,(io_context *)this);
    uVar3 = local_98._8_8_;
    uVar2 = local_98._0_8_;
    local_98._0_8_ = (element_type *)0x0;
    local_98._8_8_ = (element_type *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->tcpserver).
             super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    (this->tcpserver).super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar2;
    (this->tcpserver).super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
    local_38._8_8_ = 0;
    pcStack_20 = std::
                 _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/AsioBrokerServer.cpp:284:17)>
                 ::_M_invoke;
    local_38._16_8_ =
         std::
         _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/AsioBrokerServer.cpp:284:17)>
         ::_M_manager;
    local_38._0_8_ = this;
    std::
    function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
    ::operator=(&((this->tcpserver).
                  super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->dataCall,
                (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                 *)local_38);
    if ((code *)local_38._16_8_ != (code *)0x0) {
      (*(code *)local_38._16_8_)(local_38,local_38,3);
    }
    loadTCPServerData(&this->tcpPortData);
    gmlc::networking::TcpServer::start
              ((this->tcpserver).
               super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (this->udp_enabled_ == true) {
    loadUDPserver((AsioBrokerServer *)local_98,(io_context *)this);
    uVar3 = local_98._8_8_;
    uVar2 = local_98._0_8_;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (element_type *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->udpserver).
             super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->udpserver).super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)uVar2;
    (this->udpserver).super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
    local_58._8_8_ = (pointer)0x0;
    pcStack_40 = std::
                 _Function_handler<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/AsioBrokerServer.cpp:297:17)>
                 ::_M_invoke;
    local_48 = (pointer)std::
                        _Function_handler<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/AsioBrokerServer.cpp:297:17)>
                        ::_M_manager;
    local_58._0_8_ = this;
    std::function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)>::
    operator=(&((this->udpserver).
                super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mDataCall,
              (function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)>
               *)(local_70 + 0x18));
    if (local_48 != (pointer)0x0) {
      (*(code *)local_48)(local_70 + 0x18,local_70 + 0x18,3);
    }
    loadUDPServerData(&this->udpPortData);
    local_70._16_8_ =
         (this->udpserver).super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_98._0_8_ = &((element_type *)local_70._16_8_)->mRecvBuffer;
    local_98._8_8_ = (element_type *)0x400;
    ::asio::detail::reactive_socket_service<asio::ip::udp>::
    async_receive_from<asio::mutable_buffers_1,helics::udp::UdpServer::start_receive()::_lambda(std::error_code_const&,unsigned_long)_1_,asio::any_io_executor>
              ((((element_type *)local_70._16_8_)->mSocket).
               super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.service_,
               &(((element_type *)local_70._16_8_)->mSocket).
                super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_,
               (mutable_buffers_1 *)local_98,&((element_type *)local_70._16_8_)->mRemoteEndpoint,0,
               (type *)(local_70 + 0x10),
               &(((element_type *)local_70._16_8_)->mSocket).
                super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_);
  }
  if ((element_type *)local_70._8_8_ != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  return;
}

Assistant:

void AsioBrokerServer::mainLoop()
    {
#if defined(HELICS_ENABLE_TCP_CORE) || defined(HELICS_ENABLE_UDP_CORE)
        auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
#endif

#ifdef HELICS_ENABLE_TCP_CORE
        if (tcp_enabled_) {
            tcpserver = loadTCPserver(ioctx->getBaseContext());
            tcpserver->setDataCall(
                // NOLINTNEXTLINE
                [this](gmlc::networking::TcpConnection::pointer connection,
                       const char* data,
                       size_t datasize) { return tcpDataReceive(connection, data, datasize); });

            loadTCPServerData(tcpPortData);
            tcpserver->start();
        }
#endif
#ifdef HELICS_ENABLE_UDP_CORE
        if (udp_enabled_) {
            udpserver = loadUDPserver(ioctx->getBaseContext());
            udpserver->setDataCall(
                // NOLINTNEXTLINE
                [this](std::shared_ptr<udp::UdpServer> server, const char* data, size_t datasize) {
                    return udpDataReceive(server, data, datasize);
                });

            loadUDPServerData(udpPortData);
            udpserver->start_receive();
        }
#endif
    }